

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O2

void __thiscall dynamicgraph::SignalBase<int>::recompute(SignalBase<int> *this,int *param_1)

{
  ExceptionSignal *this_00;
  allocator<char> local_3d;
  ErrorCodeEnum local_3c;
  string local_38 [32];
  
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_3c = SET_IMPOSSIBLE;
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"Recompute operation not possible with this signal. ",&local_3d);
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_3c,local_38,"(while trying to recompute %s).",
             (this->name)._M_dataplus._M_p);
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

virtual inline void recompute(const Time &) {
    DG_THROW ExceptionSignal(
        ExceptionSignal::SET_IMPOSSIBLE,
        "Recompute operation not possible with this signal. ",
        "(while trying to recompute %s).", this->getName().c_str());
  }